

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

bool __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::operator==(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             *this,SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   *other)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar1 = (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  sVar2 = (this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar6 = sVar2;
  if (sVar2 == 0) {
    sVar6 = sVar1;
  }
  sVar3 = (other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  sVar4 = (other->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  sVar7 = sVar4;
  if (sVar4 == 0) {
    sVar7 = sVar3;
  }
  if (sVar6 != sVar7) {
    return false;
  }
  if (sVar2 == 0) {
    bVar5 = std::operator==((this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                            _M_elems,(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                     storage._M_elems + sVar1,(anon_class_8_1_a86c6e30)other);
    return bVar5;
  }
  if (sVar4 != 0) {
    bVar5 = std::operator==(&(this->flexible)._M_t,&(other->flexible)._M_t);
    return bVar5;
  }
  bVar5 = std::operator==((other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                          _M_elems,(other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                   storage._M_elems + sVar3,(anon_class_8_1_8991fb9c)this);
  return bVar5;
}

Assistant:

bool
  operator==(const SmallSetBase<T, N, FixedStorage, FlexibleSet>& other) const {
    if (size() != other.size()) {
      return false;
    }
    if (usingFixed()) {
      return std::all_of(fixed.storage.begin(),
                         fixed.storage.begin() + fixed.used,
                         [&other](const T& x) { return other.count(x); });
    } else if (other.usingFixed()) {
      return std::all_of(other.fixed.storage.begin(),
                         other.fixed.storage.begin() + other.fixed.used,
                         [this](const T& x) { return count(x); });
    } else {
      return flexible == other.flexible;
    }
  }